

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::lts_20240722::Cord::Prepend(Cord *this,Cord *src)

{
  string_view src_00;
  bool bVar1;
  CordRep *tree;
  Nullable<const_char_*> __str;
  size_t __len;
  undefined1 local_30 [8];
  string_view src_contents;
  CordRep *src_tree;
  Cord *src_local;
  Cord *this_local;
  
  InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
  bVar1 = empty(src);
  if (!bVar1) {
    src_contents._M_str = (char *)InlineRep::tree(&src->contents_);
    if ((Nullable<absl::cord_internal::CordRep_*>)src_contents._M_str ==
        (Nullable<absl::cord_internal::CordRep_*>)0x0) {
      __str = InlineRep::data(&src->contents_);
      __len = InlineRep::size(&src->contents_);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_30,__str,__len);
      src_00._M_str = (char *)src_contents._M_len;
      src_00._M_len = (size_t)local_30;
      Prepend(this,src_00);
    }
    else {
      cord_internal::CordRep::Ref((CordRep *)src_contents._M_str);
      tree = cord_internal::RemoveCrcNode((CordRep *)src_contents._M_str);
      InlineRep::PrependTree(&this->contents_,tree,kPrependCord);
    }
  }
  return;
}

Assistant:

void Cord::Prepend(const Cord& src) {
  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;

  CordRep* src_tree = src.contents_.tree();
  if (src_tree != nullptr) {
    CordRep::Ref(src_tree);
    contents_.PrependTree(cord_internal::RemoveCrcNode(src_tree),
                          CordzUpdateTracker::kPrependCord);
    return;
  }

  // `src` cord is inlined.
  absl::string_view src_contents(src.contents_.data(), src.contents_.size());
  return Prepend(src_contents);
}